

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O2

void highs::parallel::for_each<HEkkDual::minorUpdateRows()::__0&>
               (HighsInt start,HighsInt end,anon_class_32_4_068a6c9c *f,HighsInt grainSize)

{
  __atomic_base<int> _Var1;
  element_type *peVar2;
  char *pcVar3;
  HighsSplitDeque *pHVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t uVar7;
  HighsInt end_00;
  TaskGroup tg;
  anon_class_24_4_3f80b2e7_for_functor local_48;
  
  if (grainSize < end - start) {
    tg.workerDeque = HighsTaskExecutor::getThisWorkerDeque();
    tg.dequeHead = ((tg.workerDeque)->ownerData).head;
    end_00 = end;
    do {
      local_48.end = end_00;
      pHVar4 = tg.workerDeque;
      end_00 = local_48.end + start >> 1;
      uVar5 = ((tg.workerDeque)->ownerData).head;
      uVar6 = (ulong)uVar5;
      local_48.split = end_00;
      local_48.grainSize = grainSize;
      local_48.f = (anon_class_32_4_8f8caa33 *)f;
      if (uVar6 < 0x2000) {
        uVar7 = (uint32_t)(uVar6 + 1);
        ((tg.workerDeque)->ownerData).head = uVar7;
        ((tg.workerDeque)->taskArray)._M_elems[uVar6].metadata.stealer.
        super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined ***)((tg.workerDeque)->taskArray)._M_elems[uVar6].taskData =
             &PTR_operator___00433548;
        *(anon_class_32_4_068a6c9c **)
         (((tg.workerDeque)->taskArray)._M_elems[uVar6].taskData + 0x18) = f;
        pcVar3 = ((tg.workerDeque)->taskArray)._M_elems[uVar6].taskData;
        *(ulong *)(pcVar3 + 8) = CONCAT44(local_48.end,end_00);
        *(ulong *)(pcVar3 + 0x10) = CONCAT44(local_48._12_4_,grainSize);
        if (((tg.workerDeque)->ownerData).allStolenCopy == true) {
          ((tg.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
               uVar6 << 0x20 | uVar6 + 1;
          ((tg.workerDeque)->stealerData).allStolen._M_base._M_i = false;
          ((tg.workerDeque)->ownerData).splitCopy = uVar7;
          ((tg.workerDeque)->ownerData).allStolenCopy = false;
          if ((((tg.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
            ((tg.workerDeque)->splitRequest)._M_base._M_i = false;
          }
          peVar2 = ((tg.workerDeque)->ownerData).workerBunk.
                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          LOCK();
          _Var1._M_i = (peVar2->haveJobs).super___atomic_base<int>._M_i;
          (peVar2->haveJobs).super___atomic_base<int>._M_i =
               (peVar2->haveJobs).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (_Var1._M_i < ((tg.workerDeque)->ownerData).numWorkers + -1) {
            HighsSplitDeque::WorkerBunk::publishWork
                      (((tg.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,tg.workerDeque);
          }
        }
        else {
          HighsSplitDeque::growShared(tg.workerDeque);
        }
      }
      else {
        if ((((tg.workerDeque)->ownerData).splitCopy < 0x2000) &&
           (((tg.workerDeque)->ownerData).allStolenCopy == false)) {
          HighsSplitDeque::growShared(tg.workerDeque);
          uVar5 = (pHVar4->ownerData).head;
        }
        (pHVar4->ownerData).head = uVar5 + 1;
        HighsTask::
        Callable<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/parallel/HighsParallel.h:118:16)>
        ::anon_class_24_4_3f80b2e7_for_functor::operator()(&local_48);
      }
    } while (grainSize < end_00 - start);
    HEkkDual::minorUpdateRows::anon_class_32_4_068a6c9c::operator()(f,start,end_00);
    TaskGroup::taskWait(&tg);
    TaskGroup::~TaskGroup(&tg);
    return;
  }
  HEkkDual::minorUpdateRows::anon_class_32_4_068a6c9c::operator()(f,start,end);
  return;
}

Assistant:

void for_each(HighsInt start, HighsInt end, F&& f, HighsInt grainSize = 1) {
  if (end - start <= grainSize) {
    f(start, end);
  } else {
    TaskGroup tg;

    do {
      HighsInt split = (start + end) >> 1;
      tg.spawn([split, end, grainSize, &f]() {
        for_each(split, end, f, grainSize);
      });
      end = split;
    } while (end - start > grainSize);

    f(start, end);
    tg.taskWait();
  }
}